

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# double-conversion-bignum.cpp
# Opt level: O3

void __thiscall icu_63::double_conversion::Bignum::MultiplyByUInt64(Bignum *this,uint64_t factor)

{
  uint *puVar1;
  bool bVar2;
  ulong uVar3;
  long lVar4;
  uint uVar5;
  ulong uVar6;
  ulong uVar7;
  
  if (factor != 1) {
    if (factor == 0) {
      if (0 < this->used_digits_) {
        puVar1 = (this->bigits_).start_;
        lVar4 = 0;
        do {
          puVar1[lVar4] = 0;
          lVar4 = lVar4 + 1;
        } while (lVar4 < this->used_digits_);
      }
      this->used_digits_ = 0;
      this->exponent_ = 0;
    }
    else if (0 < this->used_digits_) {
      puVar1 = (this->bigits_).start_;
      lVar4 = 0;
      uVar3 = 0;
      do {
        uVar6 = (ulong)puVar1[lVar4];
        uVar7 = (ulong)((uint)uVar3 & 0xfffffff) + (factor & 0xffffffff) * uVar6;
        puVar1[lVar4] = (uint)uVar7 & 0xfffffff;
        uVar3 = (uVar3 >> 0x1c) + uVar6 * (factor >> 0x1c & 0xfffffffffffffff0) + (uVar7 >> 0x1c);
        lVar4 = lVar4 + 1;
        uVar6 = (ulong)this->used_digits_;
      } while (lVar4 < (long)uVar6);
      if (uVar3 != 0) {
        puVar1 = (this->bigits_).start_;
        do {
          if (0x7f < (int)uVar6) {
            abort();
          }
          puVar1[(int)uVar6] = (uint)uVar3 & 0xfffffff;
          uVar5 = this->used_digits_ + 1;
          uVar6 = (ulong)uVar5;
          this->used_digits_ = uVar5;
          bVar2 = 0xfffffff < uVar3;
          uVar3 = uVar3 >> 0x1c;
        } while (bVar2);
      }
    }
  }
  return;
}

Assistant:

void Bignum::MultiplyByUInt64(uint64_t factor) {
  if (factor == 1) return;
  if (factor == 0) {
    Zero();
    return;
  }
  ASSERT(kBigitSize < 32);
  uint64_t carry = 0;
  uint64_t low = factor & 0xFFFFFFFF;
  uint64_t high = factor >> 32;
  for (int i = 0; i < used_digits_; ++i) {
    uint64_t product_low = low * bigits_[i];
    uint64_t product_high = high * bigits_[i];
    uint64_t tmp = (carry & kBigitMask) + product_low;
    bigits_[i] = tmp & kBigitMask;
    carry = (carry >> kBigitSize) + (tmp >> kBigitSize) +
        (product_high << (32 - kBigitSize));
  }
  while (carry != 0) {
    EnsureCapacity(used_digits_ + 1);
    bigits_[used_digits_] = carry & kBigitMask;
    used_digits_++;
    carry >>= kBigitSize;
  }
}